

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O0

bool __thiscall myutils::IpcConnection::do_connect(IpcConnection *this)

{
  ConnectionSlot *pCVar1;
  bool bVar2;
  SOCKET SVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  reference pvVar7;
  FileMapping *pFVar8;
  ConnectionSlotInfo *pCVar9;
  long lVar10;
  ssize_t sVar11;
  __int_type_conflict _Var12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar13;
  thread *this_00;
  string *name;
  IpcConnection *local_170;
  code *local_168;
  undefined8 local_160;
  type local_158;
  uint *local_140;
  ShmemHead *head;
  string local_130 [32];
  ConnectionSlot *local_110;
  ConnectionSlot *slot;
  uint64_t slot_pos;
  int r;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [8];
  string addr;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  int local_34;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  IpcConnection *local_18;
  IpcConnection *this_local;
  
  if ((this->m_connected & 1U) == 0) {
    local_18 = this;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_20.__r = (rep)std::chrono::operator-(&local_28,&this->m_last_connect_time);
      local_34 = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_30,&local_34);
      bVar2 = std::chrono::operator<(&local_20,&local_30);
      if (bVar2) {
        this_local._7_1_ = 0;
      }
      else {
        ss.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::chrono::_V2::system_clock::now();
        (this->m_last_connect_time).__d.__r =
             (rep)ss.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        clear_data(this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,"?",&local_79);
        split(&this->m_addr,(string *)local_78,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58,true);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"shm_tq_ipc_",&local_d1);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_58,0);
        std::__cxx11::string::substr((ulong)&r,(ulong)pvVar7);
        std::operator+(local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0);
        std::__cxx11::string::~string((string *)&r);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        pFVar8 = (FileMapping *)operator_new(0x30);
        FileMapping::FileMapping(pFVar8);
        this->m_svr_shmem = pFVar8;
        if (this->m_svr_shmem == (FileMapping *)0x0) {
          slot_pos._4_4_ = 2;
        }
        else {
          bVar2 = FileMapping::open_shmem(this->m_svr_shmem,local_b0,0x9c50,false);
          if (bVar2) {
            pCVar9 = (ConnectionSlotInfo *)FileMapping::addr(this->m_svr_shmem);
            this->m_slot_info = pCVar9;
            if (this->m_slot_info->slot_size == 400) {
              if (this->m_socket != -1) {
                ::close(this->m_socket);
              }
              SVar3 = connect_socket("127.0.0.1",this->m_slot_info->svr_port);
              this->m_socket = SVar3;
              if ((this->m_socket == -1) || (bVar2 = check_connect(this->m_socket,2), !bVar2)) {
                slot_pos._4_4_ = 2;
              }
              else {
                set_socket_nonblock(this->m_socket,false);
                lVar10 = random();
                this->m_my_id = (long)(int)lVar10;
                sVar11 = ::send(this->m_socket,&this->m_my_id,8,0);
                slot_pos._0_4_ = (int)sVar11;
                if ((int)slot_pos == 8) {
                  slot = (ConnectionSlot *)0x0;
                  sVar11 = recv(this->m_socket,&slot,8,0);
                  slot_pos._0_4_ = (int)sVar11;
                  if ((int)slot_pos == 8) {
                    if (slot < (ConnectionSlot *)(ulong)this->m_slot_info->slot_count) {
                      local_110 = this->m_slot_info->slots + (long)slot;
                      _Var12 = std::__atomic_base::operator_cast_to_unsigned_long
                                         ((__atomic_base *)local_110);
                      if (_Var12 == this->m_my_id) {
                        this->m_slot = local_110;
                        set_socket_nonblock(this->m_socket,true);
                        pFVar8 = (FileMapping *)operator_new(0x30);
                        FileMapping::FileMapping(pFVar8);
                        this->m_my_shmem = pFVar8;
                        pFVar8 = this->m_my_shmem;
                        pCVar1 = this->m_slot;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_130,pCVar1->shmem_name,(allocator *)((long)&head + 7));
                        name = (string *)local_130;
                        bVar2 = FileMapping::open_shmem(pFVar8,name,this->m_slot->shmem_size,false);
                        iVar5 = (int)name;
                        std::__cxx11::string::~string(local_130);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&head + 7));
                        if (((bVar2 ^ 0xffU) & 1) == 0) {
                          iVar4 = SharedSemaphore::open(this->m_slot->sem_send,iVar5);
                          this->m_sem_recv = (SharedSemaphore *)CONCAT44(extraout_var,iVar4);
                          iVar5 = SharedSemaphore::open(this->m_slot->sem_recv,iVar5);
                          this->m_sem_send = (SharedSemaphore *)CONCAT44(extraout_var_00,iVar5);
                          if ((this->m_sem_recv == (SharedSemaphore *)0x0) ||
                             (this->m_sem_send == (SharedSemaphore *)0x0)) {
                            slot_pos._4_4_ = 2;
                          }
                          else {
                            local_140 = (uint *)FileMapping::addr(this->m_my_shmem);
                            pcVar13 = FileMapping::addr(this->m_my_shmem);
                            this->m_send_queue = (ShmemQueue *)(pcVar13 + (int)local_140[3]);
                            ShmemQueue::init(this->m_send_queue,(EVP_PKEY_CTX *)(ulong)local_140[2])
                            ;
                            pcVar13 = FileMapping::addr(this->m_my_shmem);
                            this->m_recv_queue = (ShmemQueue *)(pcVar13 + (int)local_140[1]);
                            ShmemQueue::init(this->m_recv_queue,(EVP_PKEY_CTX *)(ulong)*local_140);
                            set_conn_stat(this,true);
                            this->m_should_exit = false;
                            this_00 = (thread *)operator_new(8);
                            local_168 = recv_run;
                            local_160 = 0;
                            local_170 = this;
                            std::bind<void(myutils::IpcConnection::*)(),myutils::IpcConnection*>
                                      (&local_158,(offset_in_IpcConnection_to_subr *)&local_168,
                                       &local_170);
                            std::thread::
                            thread<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,,void>
                                      (this_00,&local_158);
                            this->m_recv_thread = this_00;
                            if (this->m_callback != (Connection_Callback *)0x0) {
                              (*this->m_callback->_vptr_Connection_Callback[2])(this->m_callback,1);
                            }
                            this_local._7_1_ = 1;
                            slot_pos._4_4_ = 1;
                          }
                        }
                        else {
                          slot_pos._4_4_ = 2;
                        }
                      }
                      else {
                        slot_pos._4_4_ = 2;
                      }
                    }
                    else {
                      slot_pos._4_4_ = 2;
                    }
                  }
                  else {
                    slot_pos._4_4_ = 2;
                  }
                }
                else {
                  slot_pos._4_4_ = 2;
                }
              }
            }
            else {
              slot_pos._4_4_ = 2;
            }
          }
          else {
            slot_pos._4_4_ = 2;
          }
        }
        std::__cxx11::string::~string((string *)local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
        if (slot_pos._4_4_ != 1) {
          clear_data(this);
          this_local._7_1_ = 0;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IpcConnection::do_connect() 
{
    if (m_connected) return true;

    if (m_addr.empty()) return false;

    if (system_clock::now() - m_last_connect_time < milliseconds(200))
        return false;

    m_last_connect_time = system_clock::now();

    clear_data();

    do {
        vector<string> ss;
        split(m_addr, "?", &ss);
        string addr = string("shm_tq_ipc_") + ss[0].substr(6);
        m_svr_shmem = new myutils::FileMapping();
        if (!m_svr_shmem) break;
        if (!m_svr_shmem->open_shmem(addr, sizeof(ConnectionSlotInfo), false))
            break;

        m_slot_info = (ConnectionSlotInfo*)m_svr_shmem->addr();
        if (m_slot_info->slot_size != sizeof(ConnectionSlot)) break;

        if (m_socket != INVALID_SOCKET)
            closesocket(m_socket);

        m_socket = connect_socket("127.0.0.1", m_slot_info->svr_port);
        if (m_socket == INVALID_SOCKET || !myutils::check_connect(m_socket, 2))
            break;

        set_socket_nonblock(m_socket, false);
        m_my_id = (uint64_t)myutils::random();
        int r = ::send(m_socket, (const char*)&m_my_id, sizeof(m_my_id), 0);
        if (r != sizeof(m_my_id))
            break;

        uint64_t slot_pos = 0;
        r = ::recv(m_socket, (char*)&slot_pos, sizeof(slot_pos), 0);
        if (r != sizeof(slot_pos))
            break;
	
        if (slot_pos >= m_slot_info->slot_count) break;

        auto slot = m_slot_info->slots + slot_pos;
        if (slot->client_id != m_my_id) break;

        m_slot = slot;
        set_socket_nonblock(m_socket, true);

        m_my_shmem = new myutils::FileMapping();
        if (!m_my_shmem->open_shmem(m_slot->shmem_name, m_slot->shmem_size, false))
            break;

        m_sem_recv = SharedSemaphore::open(m_slot->sem_send);
        m_sem_send = SharedSemaphore::open(m_slot->sem_recv);
        if (!m_sem_recv || !m_sem_send) break;

        ShmemHead* head = (ShmemHead*)m_my_shmem->addr();

        // different between client and server
        m_send_queue = (ShmemQueue*)(m_my_shmem->addr() + head->recv_offset);
        m_send_queue->init(head->recv_size);
        m_recv_queue = (ShmemQueue*)(m_my_shmem->addr() + head->send_offset);
        m_recv_queue->init(head->send_size);

        set_conn_stat(true);
        m_should_exit = false;
        m_recv_thread = new thread(bind(&IpcConnection::recv_run, this));

        if (m_callback)
            m_callback->on_conn_status(true);

        return true;

    } while (false);

    clear_data();

    return false;
}